

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.cpp
# Opt level: O3

void __thiscall PseudoTopoOrder::FillDP(PseudoTopoOrder *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pvVar5;
  pointer pNVar6;
  pointer piVar7;
  ostream *poVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  pointer pNVar13;
  int iVar14;
  
  piVar2 = (this->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  iVar12 = this->first_unknown;
  iVar11 = 0;
  if (this->best_index < iVar12) {
    iVar11 = (this->dynamic_programming).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[this->best_index];
  }
  iVar10 = (int)((ulong)((long)(this->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  if (iVar12 < iVar10) {
    piVar3 = (this->pto_inverse).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->dynamic_programming).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar5 = (this->m_parent->m_ingraph).
             super__Vector_base<std::vector<NeighborNode,_std::allocator<NeighborNode>_>,_std::allocator<std::vector<NeighborNode,_std::allocator<NeighborNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar1 = piVar2[iVar12];
      piVar4[iVar12] = 0;
      pNVar13 = pvVar5[iVar1].super__Vector_base<NeighborNode,_std::allocator<NeighborNode>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pNVar6 = *(pointer *)
                ((long)&pvVar5[iVar1].
                        super__Vector_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (pNVar13 != pNVar6) {
        piVar7 = (this->best_parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar12 = piVar3[(*pNVar13).node];
          iVar1 = this->first_unknown;
          if ((iVar12 < iVar1) &&
             (iVar14 = (*pNVar13).weight + piVar4[iVar12], piVar4[iVar1] < iVar14)) {
            piVar4[iVar1] = iVar14;
            piVar7[this->first_unknown] = iVar12;
            if (iVar11 < iVar14) {
              this->best_index = this->first_unknown;
              iVar11 = iVar14;
            }
          }
          pNVar13 = pNVar13 + 1;
        } while (pNVar13 != pNVar6);
      }
      iVar12 = this->first_unknown + 1;
      this->first_unknown = iVar12;
    } while (iVar12 < iVar10);
  }
  if (this->global_best < iVar11) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PTO improved path to ",0x15);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," at ",4);
    if (TimeFromStart()::C == '\0') {
      FillDP();
    }
    lVar9 = std::chrono::_V2::system_clock::now();
    poVar8 = std::ostream::_M_insert<double>((double)((lVar9 - TimeFromStart()::C) / 1000) * 1e-06);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    this->global_best = iVar11;
  }
  return;
}

Assistant:

void PseudoTopoOrder::FillDP()
{
	int n = pto.size();
	int best_val = 0;

	if (best_index < first_unknown)
	{
		best_val = dynamic_programming[best_index];
	}

// 	std::cout << "\nAt the beginning of filldp, first unknown: " << first_unknown << "/" << n << " and value of bestindex = " << dynamic_programming[best_index] << std::endl;
	for ( ; first_unknown < n; ++first_unknown)
	{
		int u = pto[first_unknown];
		dynamic_programming[first_unknown] = 0;

		auto& neigh = m_parent.inneighbors(u);

		for (auto v : neigh)
		{
			auto j = pto_inverse[v];

			if (first_unknown <= j)   // should be ignored
			{
				continue;
			}

			auto candidate = dynamic_programming[j] + v.Weight();

			if (candidate > dynamic_programming[first_unknown])
			{
				dynamic_programming[first_unknown] = candidate;
				best_parent[first_unknown] = j;

				if (candidate > best_val)
				{
// 					cout << "Fill: new best value at " << i << " with value " << best_val << endl;
					best_val = candidate;
					best_index = first_unknown;
				}
			}
		}
	}
	if (best_val > global_best)
	{
		std::cout << "PTO improved path to " << best_val << " at " << TimeFromStart() << std::endl;
		global_best = best_val;
	}

// 	std::cout << "\nreturning value: " << best_val << " = " << dynamic_programming[best_index] << std::endl;
}